

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidgload.c
# Opt level: O0

FT_Error cid_load_glyph(T1_Decoder_conflict decoder,FT_UInt glyph_index)

{
  FT_Memory memory_00;
  long lVar1;
  int iVar2;
  FT_ULong FVar3;
  FT_ULong FVar4;
  FT_Int *pFVar5;
  long lVar6;
  FT_Fixed FVar7;
  uint local_a94;
  long local_a90;
  FT_Incremental_MetricsRec metrics;
  CFF_SubFontRec subfont;
  PS_Decoder psdecoder;
  FT_UInt cs_offset;
  CID_Subrs cid_subrs;
  CID_FaceDict dict;
  FT_ULong off2;
  FT_ULong off1;
  undefined1 auStack_88 [4];
  FT_UInt entry_len;
  FT_Data glyph_data;
  FT_Incremental_InterfaceRec *inc;
  FT_Bool force_scaling;
  PSAux_Service psaux;
  FT_ULong glyph_length;
  FT_Memory memory;
  FT_Byte *charstring;
  FT_Stream pFStack_40;
  FT_Error error;
  FT_Stream stream;
  FT_ULong fd_select;
  FT_Byte *p;
  CID_FaceInfo cid;
  CID_Face face;
  T1_Decoder_conflict pTStack_10;
  FT_UInt glyph_index_local;
  T1_Decoder_conflict decoder_local;
  
  cid = (CID_FaceInfo)(decoder->builder).face;
  p = (FT_Byte *)(cid->xuid + 0xe);
  pFStack_40 = (FT_Stream)cid[1].cid_count;
  charstring._4_4_ = 0;
  memory = (FT_Memory)0x0;
  memory_00 = (FT_Memory)cid->xuid[4];
  lVar1 = cid->xuid[0xd];
  inc._7_1_ = false;
  glyph_data._8_8_ = ((FT_Face_Internal)cid->xuid[0xb])->incremental_interface;
  face._4_4_ = glyph_index;
  pTStack_10 = decoder;
  if ((FT_Incremental_InterfaceRec *)glyph_data._8_8_ == (FT_Incremental_InterfaceRec *)0x0) {
    iVar2 = *(int *)(cid[1].xuid + 9) + *(int *)((long)cid[1].xuid + 0x4c);
    charstring._4_4_ =
         FT_Stream_Seek(pFStack_40,cid[1].xuid[8] + (ulong)(glyph_index * iVar2) + cid[1].xuid[0xd])
    ;
    if ((charstring._4_4_ != 0) ||
       (charstring._4_4_ = FT_Stream_EnterFrame(pFStack_40,(ulong)(uint)(iVar2 * 2)),
       charstring._4_4_ != 0)) goto LAB_002fb38f;
    fd_select = (FT_ULong)pFStack_40->cursor;
    stream = (FT_Stream)cid_get_offset((FT_Byte **)&fd_select,*(FT_UInt *)(p + 0x120));
    FVar3 = cid_get_offset((FT_Byte **)&fd_select,*(FT_UInt *)(p + 0x124));
    fd_select = fd_select + *(uint *)(p + 0x120);
    FVar4 = cid_get_offset((FT_Byte **)&fd_select,*(FT_UInt *)(p + 0x124));
    FT_Stream_ExitFrame(pFStack_40);
    if (((FT_Stream)(ulong)*(uint *)(p + 0x130) <= stream) ||
       ((pFStack_40->size < FVar4 || (FVar4 < FVar3)))) {
      charstring._4_4_ = 9;
      goto LAB_002fb38f;
    }
    psaux = (PSAux_Service)(FVar4 - FVar3);
    if (((psaux == (PSAux_Service)0x0) ||
        (memory = (FT_Memory)
                  ft_mem_qalloc(memory_00,(FT_Long)psaux,(FT_Error *)((long)&charstring + 4)),
        charstring._4_4_ != 0)) ||
       (charstring._4_4_ =
             FT_Stream_ReadAt(pFStack_40,*(long *)(p + 0x140) + FVar3,(FT_Byte *)memory,
                              (FT_ULong)psaux), charstring._4_4_ != 0)) goto LAB_002fb38f;
    charstring._4_4_ = 0;
  }
  else {
    charstring._4_4_ =
         (*((FT_Incremental_InterfaceRec *)glyph_data._8_8_)->funcs->get_glyph_data)
                   (((FT_Incremental_InterfaceRec *)glyph_data._8_8_)->object,glyph_index,
                    (FT_Data *)auStack_88);
    if ((charstring._4_4_ != 0) || ((uint)glyph_data.pointer < *(uint *)(p + 0x120)))
    goto LAB_002fb38f;
    fd_select = (FT_ULong)_auStack_88;
    stream = (FT_Stream)cid_get_offset((FT_Byte **)&fd_select,*(FT_UInt *)(p + 0x120));
    psaux = (PSAux_Service)(ulong)((uint)glyph_data.pointer - *(int *)(p + 0x120));
    memory = (FT_Memory)ft_mem_qalloc(memory_00,(FT_Long)psaux,(FT_Error *)((long)&charstring + 4));
    if (charstring._4_4_ == 0) {
      memcpy(memory,_auStack_88 + *(uint *)(p + 0x120),(size_t)psaux);
    }
    (**(code **)(*(long *)glyph_data._8_8_ + 8))(*(undefined8 *)(glyph_data._8_8_ + 8),auStack_88);
    if (charstring._4_4_ != 0) goto LAB_002fb38f;
  }
  pFVar5 = (FT_Int *)(cid[1].xuid[0xf] + (long)stream * 0x10);
  pTStack_10->num_subrs = *pFVar5;
  pTStack_10->subrs = *(FT_Byte ***)(pFVar5 + 2);
  pTStack_10->subrs_len = (FT_UInt *)0x0;
  pTStack_10->subrs_hash = (FT_Hash)0x0;
  lVar6 = *(long *)(p + 0x138) + (long)stream * 0x150;
  (pTStack_10->font_matrix).xx = *(FT_Fixed *)(lVar6 + 0x108);
  (pTStack_10->font_matrix).xy = *(FT_Fixed *)(lVar6 + 0x110);
  (pTStack_10->font_matrix).yx = *(FT_Fixed *)(lVar6 + 0x118);
  (pTStack_10->font_matrix).yy = *(FT_Fixed *)(lVar6 + 0x120);
  (pTStack_10->font_offset).x = *(FT_Pos *)(lVar6 + 0x128);
  (pTStack_10->font_offset).y = *(FT_Pos *)(lVar6 + 0x130);
  pTStack_10->lenIV = *(FT_Int *)(lVar6 + 4);
  if (pTStack_10->lenIV < 0) {
    local_a94 = 0;
  }
  else {
    local_a94 = pTStack_10->lenIV;
  }
  if (psaux < (PSAux_Service)(ulong)local_a94) {
    charstring._4_4_ = 9;
  }
  else {
    if (-1 < pTStack_10->lenIV) {
      (**(code **)(lVar1 + 0x20))(memory,psaux,0x10ea);
    }
    if ((pTStack_10->builder).metrics_only == '\0') {
      (**(code **)(lVar1 + 0x30))(&subfont.random,pTStack_10,1);
      (**(code **)(lVar1 + 0x38))(cid,lVar6,&metrics.advance_v);
      charstring._4_4_ =
           (**(code **)(*(long *)(lVar1 + 0x18) + 0x18))
                     (&subfont.random,(long)&memory->user + (ulong)local_a94,
                      (long)psaux - (ulong)local_a94);
      inc._7_1_ = (charstring._4_4_ & 0xff) == 0xa4;
      if (inc._7_1_) {
        *(undefined1 *)&(pTStack_10->builder).glyph[1].library = 0;
        charstring._4_4_ =
             (**(code **)(*(long *)(lVar1 + 0x18) + 0x18))
                       (&subfont.random,(long)&memory->user + (ulong)local_a94,
                        (long)psaux - (ulong)local_a94);
      }
    }
    else {
      charstring._4_4_ =
           (**(code **)(*(long *)(lVar1 + 0x18) + 0x10))
                     (pTStack_10,(long)&memory->user + (ulong)local_a94,
                      (long)psaux - (ulong)local_a94 & 0xffffffff);
    }
    if (((charstring._4_4_ == 0) && (glyph_data._8_8_ != 0)) &&
       (*(long *)(*(long *)glyph_data._8_8_ + 0x10) != 0)) {
      FVar7 = FT_RoundFix((pTStack_10->builder).left_bearing.x);
      local_a90 = FVar7 >> 0x10;
      metrics.bearing_x = 0;
      FVar7 = FT_RoundFix((pTStack_10->builder).advance.x);
      metrics.bearing_y = FVar7 >> 0x10;
      FVar7 = FT_RoundFix((pTStack_10->builder).advance.y);
      metrics.advance = FVar7 >> 0x10;
      charstring._4_4_ =
           (**(code **)(*(long *)glyph_data._8_8_ + 0x10))
                     (*(undefined8 *)(glyph_data._8_8_ + 8),face._4_4_,0,&local_a90);
      (pTStack_10->builder).left_bearing.x = local_a90 << 0x10;
      (pTStack_10->builder).advance.x = metrics.bearing_y << 0x10;
      (pTStack_10->builder).advance.y = metrics.advance << 0x10;
    }
  }
LAB_002fb38f:
  ft_mem_free(memory_00,memory);
  *(bool *)((long)&(pTStack_10->builder).glyph[1].library + 1) = inc._7_1_;
  return charstring._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  cid_load_glyph( T1_Decoder  decoder,
                  FT_UInt     glyph_index )
  {
    CID_Face       face = (CID_Face)decoder->builder.face;
    CID_FaceInfo   cid  = &face->cid;
    FT_Byte*       p;
    FT_ULong       fd_select;
    FT_Stream      stream       = face->cid_stream;
    FT_Error       error        = FT_Err_Ok;
    FT_Byte*       charstring   = NULL;
    FT_Memory      memory       = face->root.memory;
    FT_ULong       glyph_length = 0;
    PSAux_Service  psaux        = (PSAux_Service)face->psaux;

    FT_Bool  force_scaling = FALSE;

#ifdef FT_CONFIG_OPTION_INCREMENTAL
    FT_Incremental_InterfaceRec  *inc =
                                   face->root.internal->incremental_interface;
#endif


    FT_TRACE1(( "cid_load_glyph: glyph index %u\n", glyph_index ));

#ifdef FT_CONFIG_OPTION_INCREMENTAL

    /* For incremental fonts get the character data using */
    /* the callback function.                             */
    if ( inc )
    {
      FT_Data  glyph_data;


      error = inc->funcs->get_glyph_data( inc->object,
                                          glyph_index, &glyph_data );
      if ( error || glyph_data.length < cid->fd_bytes )
        goto Exit;

      p         = (FT_Byte*)glyph_data.pointer;
      fd_select = cid_get_offset( &p, cid->fd_bytes );

      glyph_length = glyph_data.length - cid->fd_bytes;

      if ( !FT_QALLOC( charstring, glyph_length ) )
        FT_MEM_COPY( charstring, glyph_data.pointer + cid->fd_bytes,
                     glyph_length );

      inc->funcs->free_glyph_data( inc->object, &glyph_data );

      if ( error )
        goto Exit;
    }

    else

#endif /* FT_CONFIG_OPTION_INCREMENTAL */

    /* For ordinary fonts read the CID font dictionary index */
    /* and charstring offset from the CIDMap.                */
    {
      FT_UInt   entry_len = cid->fd_bytes + cid->gd_bytes;
      FT_ULong  off1, off2;


      if ( FT_STREAM_SEEK( cid->data_offset + cid->cidmap_offset +
                           glyph_index * entry_len )               ||
           FT_FRAME_ENTER( 2 * entry_len )                         )
        goto Exit;

      p         = (FT_Byte*)stream->cursor;
      fd_select = cid_get_offset( &p, cid->fd_bytes );
      off1      = cid_get_offset( &p, cid->gd_bytes );
      p        += cid->fd_bytes;
      off2      = cid_get_offset( &p, cid->gd_bytes );
      FT_FRAME_EXIT();

      if ( fd_select >= cid->num_dicts ||
           off2 > stream->size         ||
           off1 > off2                 )
      {
        FT_TRACE0(( "cid_load_glyph: invalid glyph stream offsets\n" ));
        error = FT_THROW( Invalid_Offset );
        goto Exit;
      }

      glyph_length = off2 - off1;

      if ( glyph_length == 0                             ||
           FT_QALLOC( charstring, glyph_length )         ||
           FT_STREAM_READ_AT( cid->data_offset + off1,
                              charstring, glyph_length ) )
        goto Exit;
    }

    /* Now set up the subrs array and parse the charstrings. */
    {
      CID_FaceDict  dict;
      CID_Subrs     cid_subrs = face->subrs + fd_select;
      FT_UInt       cs_offset;


      /* Set up subrs */
      decoder->num_subrs  = cid_subrs->num_subrs;
      decoder->subrs      = cid_subrs->code;
      decoder->subrs_len  = 0;
      decoder->subrs_hash = NULL;

      /* Set up font matrix */
      dict                 = cid->font_dicts + fd_select;

      decoder->font_matrix = dict->font_matrix;
      decoder->font_offset = dict->font_offset;
      decoder->lenIV       = dict->private_dict.lenIV;

      /* Decode the charstring. */

      /* Adjustment for seed bytes. */
      cs_offset = decoder->lenIV >= 0 ? (FT_UInt)decoder->lenIV : 0;
      if ( cs_offset > glyph_length )
      {
        FT_TRACE0(( "cid_load_glyph: invalid glyph stream offsets\n" ));
        error = FT_THROW( Invalid_Offset );
        goto Exit;
      }

      /* Decrypt only if lenIV >= 0. */
      if ( decoder->lenIV >= 0 )
        psaux->t1_decrypt( charstring, glyph_length, 4330 );

      /* choose which renderer to use */
#ifdef T1_CONFIG_OPTION_OLD_ENGINE
      if ( ( (PS_Driver)FT_FACE_DRIVER( face ) )->hinting_engine ==
               FT_HINTING_FREETYPE                                  ||
           decoder->builder.metrics_only                            )
        error = psaux->t1_decoder_funcs->parse_charstrings_old(
                  decoder,
                  charstring + cs_offset,
                  glyph_length - cs_offset );
#else
      if ( decoder->builder.metrics_only )
        error = psaux->t1_decoder_funcs->parse_metrics(
                  decoder,
                  charstring + cs_offset,
                  glyph_length - cs_offset );
#endif
      else
      {
        PS_Decoder      psdecoder;
        CFF_SubFontRec  subfont;


        psaux->ps_decoder_init( &psdecoder, decoder, TRUE );

        psaux->t1_make_subfont( FT_FACE( face ),
                                &dict->private_dict,
                                &subfont );
        psdecoder.current_subfont = &subfont;

        error = psaux->t1_decoder_funcs->parse_charstrings(
                  &psdecoder,
                  charstring + cs_offset,
                  glyph_length - cs_offset );

        /* Adobe's engine uses 16.16 numbers everywhere;              */
        /* as a consequence, glyphs larger than 2000ppem get rejected */
        if ( FT_ERR_EQ( error, Glyph_Too_Big ) )
        {
          /* this time, we retry unhinted and scale up the glyph later on */
          /* (the engine uses and sets the hardcoded value 0x10000 / 64 = */
          /* 0x400 for both `x_scale' and `y_scale' in this case)         */
          ((CID_GlyphSlot)decoder->builder.glyph)->hint = FALSE;

          force_scaling = TRUE;

          error = psaux->t1_decoder_funcs->parse_charstrings(
                    &psdecoder,
                    charstring + cs_offset,
                    glyph_length - cs_offset );
        }
      }
    }

#ifdef FT_CONFIG_OPTION_INCREMENTAL

    /* Incremental fonts can optionally override the metrics. */
    if ( !error && inc && inc->funcs->get_glyph_metrics )
    {
      FT_Incremental_MetricsRec  metrics;


      metrics.bearing_x = FIXED_TO_INT( decoder->builder.left_bearing.x );
      metrics.bearing_y = 0;
      metrics.advance   = FIXED_TO_INT( decoder->builder.advance.x );
      metrics.advance_v = FIXED_TO_INT( decoder->builder.advance.y );

      error = inc->funcs->get_glyph_metrics( inc->object,
                                             glyph_index, FALSE, &metrics );

      decoder->builder.left_bearing.x = INT_TO_FIXED( metrics.bearing_x );
      decoder->builder.advance.x      = INT_TO_FIXED( metrics.advance );
      decoder->builder.advance.y      = INT_TO_FIXED( metrics.advance_v );
    }

#endif /* FT_CONFIG_OPTION_INCREMENTAL */

  Exit:
    FT_FREE( charstring );

    ((CID_GlyphSlot)decoder->builder.glyph)->scaled = force_scaling;

    return error;
  }